

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc.cc
# Opt level: O0

Ownership __thiscall TCMallocImplementation::GetOwnership(TCMallocImplementation *this,void *ptr)

{
  bool bVar1;
  PageHeap *this_00;
  Span *span;
  ulong uStack_60;
  uint32_t cl;
  PageID p;
  void *ptr_local;
  TCMallocImplementation *this_local;
  ulong local_40;
  PageHeap *local_38;
  ulong local_30;
  Number i2;
  Number i1;
  PageMap *local_18;
  void *local_10;
  
  uStack_60 = (ulong)ptr >> 0xd;
  if ((ulong)ptr >> 0x30 == 0) {
    p = (PageID)ptr;
    ptr_local = this;
    this_00 = tcmalloc::Static::pageheap();
    bVar1 = tcmalloc::PageHeap::TryGetSizeClass(this_00,uStack_60,(uint32_t *)((long)&span + 4));
    if (bVar1) {
      this_local._4_4_ = kOwned;
    }
    else {
      local_38 = tcmalloc::Static::pageheap();
      local_40 = uStack_60;
      local_18 = &local_38->pagemap_;
      i1 = uStack_60;
      i2 = uStack_60 >> 0x12;
      local_30 = uStack_60 & 0x3ffff;
      if ((uStack_60 >> 0x23 == 0) && (local_18->root_[i2] != (Leaf *)0x0)) {
        local_10 = local_18->root_[i2]->values[local_30];
      }
      else {
        local_10 = (void *)0x0;
      }
      if (local_10 == (void *)0x0) {
        bVar1 = tcmalloc::IsEmergencyPtr((void *)p);
        this_local._4_4_ = kNotOwned;
        if (bVar1) {
          this_local._4_4_ = kOwned;
        }
      }
      else {
        this_local._4_4_ = kOwned;
      }
    }
  }
  else {
    this_local._4_4_ = kNotOwned;
  }
  return this_local._4_4_;
}

Assistant:

virtual Ownership GetOwnership(const void* ptr) {
    const PageID p = reinterpret_cast<uintptr_t>(ptr) >> kPageShift;
    // The rest of tcmalloc assumes that all allocated pointers use at
    // most kAddressBits bits.  If ptr doesn't, then it definitely
    // wasn't alloacted by tcmalloc.
    if ((p >> (kAddressBits - kPageShift)) > 0) {
      return kNotOwned;
    }
    uint32_t cl;
    if (Static::pageheap()->TryGetSizeClass(p, &cl)) {
      return kOwned;
    }
    const Span *span = Static::pageheap()->GetDescriptor(p);
    if (span) {
      return kOwned;
    }
    return tcmalloc::IsEmergencyPtr(ptr) ? kOwned : kNotOwned;
  }